

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcOpeningElement::IfcOpeningElement(IfcOpeningElement *this)

{
  *(undefined ***)&(this->super_IfcFeatureElementSubtraction).field_0x168 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x170 = 0;
  *(char **)&this->field_0x178 = "IfcOpeningElement";
  IfcFeatureElementSubtraction::IfcFeatureElementSubtraction
            (&this->super_IfcFeatureElementSubtraction,&PTR_construction_vtable_24__007be150);
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x7bdff8;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).field_0x168 = 0x7be138;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x7be020;
  (this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x7be048;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x7be070;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x7be098;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x138
       = 0x7be0c0;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x148
       = 0x7be0e8;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158 =
       0x7be110;
  return;
}

Assistant:

IfcOpeningElement() : Object("IfcOpeningElement") {}